

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          Contains *exception_string)

{
  anon_union_24_2_13149d16_for_String_3 local_70;
  StringContains local_58;
  
  String::copy((String *)&local_70.data,(EVP_PKEY_CTX *)exception_string,(EVP_PKEY_CTX *)file);
  local_58.content.string.field_0._8_8_ = local_70._8_8_;
  local_70.buf[0] = '\0';
  local_70.buf[0x17] = '\x17';
  local_58.isContains = true;
  AssertData::AssertData(&this->super_AssertData,at,file,line,expr,exception_type,&local_58);
  String::~String((String *)&local_58);
  String::~String((String *)&local_70.data);
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
        const char* exception_type, const Contains& exception_string)
        : AssertData(at, file, line, expr, exception_type, exception_string) { }